

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

BinaryOps LLVMBC::translate_binop(BinOp op,Type *type)

{
  bool bVar1;
  bool is_fp;
  Type *type_local;
  BinOp op_local;
  
  bVar1 = Type::isFloatingPointTy(type);
  switch(op) {
  case ADD:
    type_local._4_4_ = Add;
    if (bVar1) {
      type_local._4_4_ = FAdd;
    }
    break;
  case SUB:
    type_local._4_4_ = Sub;
    if (bVar1) {
      type_local._4_4_ = FSub;
    }
    break;
  case MUL:
    type_local._4_4_ = Mul;
    if (bVar1) {
      type_local._4_4_ = FMul;
    }
    break;
  case UDIV:
    type_local._4_4_ = UDiv;
    if (bVar1) {
      type_local._4_4_ = InvalidBinaryOp;
    }
    break;
  case SDIV:
    type_local._4_4_ = SDiv;
    if (bVar1) {
      type_local._4_4_ = FDiv;
    }
    break;
  case UREM:
    type_local._4_4_ = URem;
    if (bVar1) {
      type_local._4_4_ = InvalidBinaryOp;
    }
    break;
  case SREM:
    type_local._4_4_ = SRem;
    if (bVar1) {
      type_local._4_4_ = FRem;
    }
    break;
  case SHL:
    type_local._4_4_ = Shl;
    if (bVar1) {
      type_local._4_4_ = InvalidBinaryOp;
    }
    break;
  case LSHR:
    type_local._4_4_ = LShr;
    if (bVar1) {
      type_local._4_4_ = InvalidBinaryOp;
    }
    break;
  case ASHR:
    type_local._4_4_ = AShr;
    if (bVar1) {
      type_local._4_4_ = InvalidBinaryOp;
    }
    break;
  case AND:
    type_local._4_4_ = And;
    if (bVar1) {
      type_local._4_4_ = InvalidBinaryOp;
    }
    break;
  case OR:
    type_local._4_4_ = Or;
    if (bVar1) {
      type_local._4_4_ = InvalidBinaryOp;
    }
    break;
  case XOR:
    type_local._4_4_ = Xor;
    if (bVar1) {
      type_local._4_4_ = InvalidBinaryOp;
    }
    break;
  default:
    type_local._4_4_ = InvalidBinaryOp;
  }
  return type_local._4_4_;
}

Assistant:

static BinaryOperator::BinaryOps translate_binop(BinOp op, Type *type)
{
	bool is_fp = type->isFloatingPointTy();
	switch (op)
	{
	case BinOp::ADD:
		return is_fp ? BinaryOperator::BinaryOps::FAdd : BinaryOperator::BinaryOps::Add;
	case BinOp::SUB:
		return is_fp ? BinaryOperator::BinaryOps::FSub : BinaryOperator::BinaryOps::Sub;
	case BinOp::MUL:
		return is_fp ? BinaryOperator::BinaryOps::FMul : BinaryOperator::BinaryOps::Mul;
	case BinOp::UDIV:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::UDiv;
	case BinOp::SDIV:
		return is_fp ? BinaryOperator::BinaryOps::FDiv : BinaryOperator::BinaryOps::SDiv;
	case BinOp::UREM:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::URem;
	case BinOp::SREM:
		return is_fp ? BinaryOperator::BinaryOps::FRem : BinaryOperator::BinaryOps::SRem;
	case BinOp::SHL:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::Shl;
	case BinOp::LSHR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::LShr;
	case BinOp::ASHR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::AShr;
	case BinOp::AND:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::And;
	case BinOp::OR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::Or;
	case BinOp::XOR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::Xor;
	default:
		return BinaryOperator::BinaryOps::InvalidBinaryOp;
	}
}